

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rownumber_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowNtileExecutor::EvaluateInternal
          (WindowNtileExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  long lVar1;
  data_ptr_t pdVar2;
  bool bVar3;
  reference pvVar4;
  long lVar5;
  long lVar6;
  pointer this_00;
  idx_t iVar7;
  long lVar8;
  InvalidInputException *this_01;
  long lVar9;
  data_ptr_t pdVar10;
  idx_t i;
  WindowExecutorLocalState *this_02;
  unsigned_long val;
  allocator local_99;
  idx_t local_98;
  data_ptr_t local_90;
  Vector *local_88;
  data_ptr_t local_80;
  data_ptr_t local_78;
  long local_70;
  WindowInputExpression ntile_col;
  string local_50;
  
  this_02 = lstate + 2;
  local_88 = result;
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_02,0);
  pdVar10 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_02,1);
  if (*(char *)&gstate[1].super_WindowExecutorState._vptr_WindowExecutorState == '\x01') {
    pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_02,6);
    pdVar10 = pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)this_02,7);
  }
  local_78 = pvVar4->data;
  local_80 = local_88->data;
  WindowInputExpression::WindowInputExpression
            (&ntile_col,eval_chunk,(this->super_WindowRowNumberExecutor).ntile_idx);
  i = 0;
  local_98 = count;
  local_90 = pdVar10;
  do {
    if (count == i) {
      return;
    }
    bVar3 = WindowInputExpression::CellIsNull(&ntile_col,i);
    if (bVar3) {
      FlatVector::SetNull(local_88,i,true);
    }
    else {
      lVar5 = WindowInputExpression::GetCell<long>(&ntile_col,i);
      pdVar2 = local_78;
      if (lVar5 < 1) {
        this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Argument for ntile must be greater than zero",&local_99);
        InvalidInputException::InvalidInputException(this_01,&local_50);
        __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        (*(long *)(local_78 + i * 8) - *(long *)(pdVar10 + i * 8));
      if (lVar6 <= lVar5) {
        lVar5 = lVar6;
      }
      local_70 = lVar6 % lVar5;
      if (gstate[1].executor == (WindowExecutor *)0x0) {
        val = (row_idx + i) - *(long *)(pdVar10 + i * 8);
      }
      else {
        this_00 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                                *)&gstate[1].executor);
        iVar7 = WindowTokenTree::Rank
                          (this_00,*(idx_t *)(pdVar10 + i * 8),*(idx_t *)(pdVar2 + i * 8),
                           row_idx + i);
        val = iVar7 - 1;
      }
      lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
      lVar1 = lVar6 / lVar5 + 1;
      lVar9 = local_70 * lVar1;
      if (lVar8 < lVar9) {
        lVar8 = lVar8 / lVar1;
      }
      else {
        lVar8 = (lVar8 - lVar9) / (lVar6 / lVar5) + local_70;
      }
      *(long *)(local_80 + i * 8) = lVar8 + 1;
      count = local_98;
      pdVar10 = local_90;
    }
    i = i + 1;
  } while( true );
}

Assistant:

void WindowNtileExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                           DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &grstate = gstate.Cast<WindowRowNumberGlobalState>();
	auto &lrstate = lstate.Cast<WindowRowNumberLocalState>();
	auto partition_begin = FlatVector::GetData<const idx_t>(lrstate.bounds.data[PARTITION_BEGIN]);
	auto partition_end = FlatVector::GetData<const idx_t>(lrstate.bounds.data[PARTITION_END]);
	if (grstate.use_framing) {
		// With secondary sorts, we restrict to the frame boundaries, but everything else should compute the same.
		partition_begin = FlatVector::GetData<const idx_t>(lrstate.bounds.data[FRAME_BEGIN]);
		partition_end = FlatVector::GetData<const idx_t>(lrstate.bounds.data[FRAME_END]);
	}
	auto rdata = FlatVector::GetData<int64_t>(result);
	WindowInputExpression ntile_col(eval_chunk, ntile_idx);
	for (idx_t i = 0; i < count; ++i, ++row_idx) {
		if (ntile_col.CellIsNull(i)) {
			FlatVector::SetNull(result, i, true);
		} else {
			auto n_param = ntile_col.GetCell<int64_t>(i);
			if (n_param < 1) {
				throw InvalidInputException("Argument for ntile must be greater than zero");
			}
			// With thanks from SQLite's ntileValueFunc()
			auto n_total = NumericCast<int64_t>(partition_end[i] - partition_begin[i]);
			if (n_param > n_total) {
				// more groups allowed than we have values
				// map every entry to a unique group
				n_param = n_total;
			}
			int64_t n_size = (n_total / n_param);
			// find the row idx within the group
			D_ASSERT(row_idx >= partition_begin[i]);
			idx_t partition_idx = 0;
			if (grstate.token_tree) {
				partition_idx = grstate.token_tree->Rank(partition_begin[i], partition_end[i], row_idx) - 1;
			} else {
				partition_idx = row_idx - partition_begin[i];
			}
			auto adjusted_row_idx = NumericCast<int64_t>(partition_idx);

			// now compute the ntile
			int64_t n_large = n_total - n_param * n_size;
			int64_t i_small = n_large * (n_size + 1);
			int64_t result_ntile;

			D_ASSERT((n_large * (n_size + 1) + (n_param - n_large) * n_size) == n_total);

			if (adjusted_row_idx < i_small) {
				result_ntile = 1 + adjusted_row_idx / (n_size + 1);
			} else {
				result_ntile = 1 + n_large + (adjusted_row_idx - i_small) / n_size;
			}
			// result has to be between [1, NTILE]
			D_ASSERT(result_ntile >= 1 && result_ntile <= n_param);
			rdata[i] = result_ntile;
		}
	}
}